

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_scan.hpp
# Opt level: O0

void __thiscall
duckdb::AlpRDVectorState<float>::LoadValues<false>
          (AlpRDVectorState<float> *this,EXACT_TYPE *values_buffer,idx_t count)

{
  undefined4 *in_RSI;
  uint16_t in_stack_00003fee;
  idx_t in_stack_00003ff0;
  EXACT_TYPE *in_stack_00003ff8;
  uint16_t *in_stack_00004000;
  uint8_t *in_stack_00004008;
  uint8_t *in_stack_00004010;
  uint16_t *in_stack_00004020;
  uint16_t *in_stack_00004028;
  uint8_t in_stack_00004030;
  uint8_t in_stack_00004038;
  
  *in_RSI = 0;
  alp::AlpRDDecompression<float>::Decompress
            (in_stack_00004010,in_stack_00004008,in_stack_00004000,in_stack_00003ff8,
             in_stack_00003ff0,in_stack_00003fee,in_stack_00004020,in_stack_00004028,
             in_stack_00004030,in_stack_00004038);
  return;
}

Assistant:

void LoadValues(EXACT_TYPE *values_buffer, idx_t count) {
		if (SKIP) {
			return;
		}
		values_buffer[0] = (EXACT_TYPE)0;
		alp::AlpRDDecompression<T>::Decompress(left_encoded, right_encoded, left_parts_dict, values_buffer, count,
		                                       exceptions_count, exceptions, exceptions_positions, left_bit_width,
		                                       right_bit_width);
	}